

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O1

unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> __thiscall
CS248::GLResourceManager::bindVertexArray(GLResourceManager *this,VertexArrayId vaid)

{
  undefined8 *puVar1;
  GLuint in_EDX;
  
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = &PTR__VertexArrayCleanup_00244150;
  (*__glewBindVertexArray)(in_EDX);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<CS248::Cleanup,_std::default_delete<CS248::Cleanup>,_true,_true>)
         (__uniq_ptr_data<CS248::Cleanup,_std::default_delete<CS248::Cleanup>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cleanup> GLResourceManager::bindVertexArray(VertexArrayId vaid) {
  return std::unique_ptr<Cleanup>{ new VertexArrayCleanup(vaid) };
}